

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

void Gia_ObjComputeTruthTableStop(Gia_Man_t *p)

{
  Gia_Man_t *p_local;
  
  p->nTtVars = 0;
  p->nTtWords = 0;
  Vec_IntFreeP(&p->vTtNums);
  Vec_IntFreeP(&p->vTtNodes);
  Vec_PtrFreeP(&p->vTtInputs);
  Vec_WrdFreeP(&p->vTtMemory);
  return;
}

Assistant:

void Gia_ObjComputeTruthTableStop( Gia_Man_t * p )
{
    p->nTtVars   = 0;
    p->nTtWords  = 0;
    Vec_IntFreeP( &p->vTtNums );
    Vec_IntFreeP( &p->vTtNodes );
    Vec_PtrFreeP( &p->vTtInputs );
    Vec_WrdFreeP( &p->vTtMemory );
}